

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Finder *pFVar2;
  char *pcVar3;
  ushort *puVar4;
  bool bVar5;
  __type_conflict1 _Var6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Descriptor *pDVar10;
  OneofDescriptor *oneof_descriptor;
  FieldDescriptor *pFVar11;
  MessageFactory *factory;
  Descriptor *pDVar12;
  MessageLite *this_00;
  Nonnull<int_*> out;
  Reflection *this_01;
  string *psVar13;
  AlphaNum *in_R8;
  Metadata MVar14;
  string_view str;
  string_view name;
  string_view name_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view lowercase_name;
  string_view message_07;
  string_view name_01;
  string_view message_08;
  string_view data;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  FieldDescriptor *field;
  string lower_field_name;
  string prefix_and_full_type_name;
  string field_name;
  string full_type_name;
  string serialized_value;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  AlphaNum local_148;
  string prefix;
  int start_column;
  int start_line;
  anon_class_32_4_2c58ab61 skip_parsing;
  string local_c0;
  string local_a0;
  AlphaNum local_80;
  string local_50;
  undefined4 extraout_var_02;
  
  MVar14 = Message::GetMetadata(message);
  this_01 = MVar14.reflection;
  MVar14 = Message::GetMetadata(message);
  pDVar12 = MVar14.descriptor;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field = (FieldDescriptor *)0x0;
  field_name.field_2._M_local_buf[0] = '\0';
  start_line = (this->tokenizer_).current_.line;
  out = &start_line;
  start_column = (this->tokenizer_).current_.column;
  skip_parsing.start_column = &start_column;
  skip_parsing.this = this;
  skip_parsing.field = &field;
  skip_parsing.start_line = out;
  bVar5 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lower_field_name,"[",(allocator<char> *)&local_148);
    bVar5 = TryConsume(this,&lower_field_name);
    std::__cxx11::string::~string((string *)&lower_field_name);
    if (!bVar5) goto LAB_00221225;
    full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
    full_type_name._M_string_length = 0;
    full_type_name.field_2._M_local_buf[0] = '\0';
    prefix._M_string_length = 0;
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    prefix.field_2._M_local_buf[0] = '\0';
    bVar5 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
    if (bVar5) {
      lower_field_name._M_string_length = (size_type)prefix._M_dataplus._M_p;
      lower_field_name._M_dataplus._M_p = (pointer)prefix._M_string_length;
      local_148.piece_._M_len = full_type_name._M_string_length;
      local_148.piece_._M_str = full_type_name._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&prefix_and_full_type_name,(lts_20250127 *)&lower_field_name,&local_148,
                 (AlphaNum *)full_type_name._M_string_length);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,"]",(allocator<char> *)&local_148);
      bVar5 = ConsumeBeforeWhitespace(this,&lower_field_name);
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (bVar5) {
        TryConsumeWhitespace(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lower_field_name,":",(allocator<char> *)&local_148);
        bVar5 = TryConsumeBeforeWhitespace(this,&lower_field_name);
        std::__cxx11::string::~string((string *)&lower_field_name);
        if (bVar5) {
          TryConsumeWhitespace(this);
        }
        paVar1 = &serialized_value.field_2;
        serialized_value._M_string_length = 0;
        serialized_value.field_2._M_local_buf[0] = '\0';
        pFVar2 = this->finder_;
        serialized_value._M_dataplus._M_p = (pointer)paVar1;
        if (pFVar2 == (Finder *)0x0) {
          pDVar12 = anon_unknown_14::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
        }
        else {
          iVar9 = (*pFVar2->_vptr_Finder[4])(pFVar2,message,&prefix,&full_type_name);
          pDVar12 = (Descriptor *)CONCAT44(extraout_var,iVar9);
        }
        if (pDVar12 == (Descriptor *)0x0) {
          lower_field_name._0_16_ = absl::lts_20250127::NullSafeStringView("Could not find type \"")
          ;
          local_148.piece_._M_len = prefix_and_full_type_name._M_string_length;
          local_148.piece_._M_str = prefix_and_full_type_name._M_dataplus._M_p;
          local_80.piece_ =
               absl::lts_20250127::NullSafeStringView("\" stored in google.protobuf.Any.");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_50,(lts_20250127 *)&lower_field_name,&local_148,&local_80,in_R8);
          message_06._M_str = local_50._M_dataplus._M_p;
          message_06._M_len = local_50._M_string_length;
          ReportError(this,message_06);
          std::__cxx11::string::~string((string *)&local_50);
LAB_00221ced:
          bVar5 = false;
        }
        else {
          bVar5 = ConsumeAnyValue(this,pDVar12,&serialized_value);
          if (!bVar5) goto LAB_00221ced;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((bVar5 = FieldDescriptor::is_repeated(any_type_url_field), !bVar5 &&
               (bVar5 = Reflection::HasField(this_01,message,any_type_url_field), bVar5)) ||
              ((bVar5 = FieldDescriptor::is_repeated(any_value_field), !bVar5 &&
               (bVar5 = Reflection::HasField(this_01,message,any_value_field), bVar5)))))) {
            message_05._M_str = "Non-repeated Any specified multiple times.";
            message_05._M_len = 0x2a;
            ReportError(this,message_05);
            goto LAB_00221ced;
          }
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)prefix_and_full_type_name._M_dataplus._M_p == &prefix_and_full_type_name.field_2) {
            local_a0.field_2._8_8_ = prefix_and_full_type_name.field_2._8_8_;
          }
          else {
            local_a0._M_dataplus._M_p = prefix_and_full_type_name._M_dataplus._M_p;
          }
          local_a0._M_string_length = prefix_and_full_type_name._M_string_length;
          prefix_and_full_type_name._M_string_length = 0;
          prefix_and_full_type_name.field_2._M_local_buf[0] = '\0';
          prefix_and_full_type_name._M_dataplus._M_p = (pointer)&prefix_and_full_type_name.field_2;
          Reflection::SetString(this_01,message,any_type_url_field,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)serialized_value._M_dataplus._M_p == paVar1) {
            local_c0.field_2._8_8_ = serialized_value.field_2._8_8_;
          }
          else {
            local_c0._M_dataplus._M_p = serialized_value._M_dataplus._M_p;
          }
          local_c0.field_2._M_allocated_capacity._1_7_ =
               serialized_value.field_2._M_allocated_capacity._1_7_;
          local_c0.field_2._M_local_buf[0] = serialized_value.field_2._M_local_buf[0];
          local_c0._M_string_length = serialized_value._M_string_length;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          serialized_value._M_dataplus._M_p = (pointer)paVar1;
          Reflection::SetString(this_01,message,any_value_field,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          bVar5 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,true);
        }
        std::__cxx11::string::~string((string *)&serialized_value);
      }
      else {
        bVar5 = false;
      }
      std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
    }
    else {
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&prefix);
    psVar13 = &full_type_name;
LAB_002220b7:
    std::__cxx11::string::~string((string *)psVar13);
    goto LAB_002220bc;
  }
LAB_00221225:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lower_field_name,"[",(allocator<char> *)&local_148);
  bVar5 = TryConsume(this,&lower_field_name);
  std::__cxx11::string::~string((string *)&lower_field_name);
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,&field_name);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,"]",(allocator<char> *)&local_148);
      bVar5 = ConsumeBeforeWhitespace(this,&lower_field_name);
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (bVar5) {
        TryConsumeWhitespace(this);
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          field = anon_unknown_14::DefaultFinderFindExtension(message,&field_name);
        }
        else {
          iVar9 = (*pFVar2->_vptr_Finder[2])(pFVar2,message,&field_name);
          field = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar9);
        }
        if (field == (FieldDescriptor *)0x0) {
          if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
            lower_field_name._0_16_ = absl::lts_20250127::NullSafeStringView("Extension \"");
            local_148.piece_._M_len = field_name._M_string_length;
            local_148.piece_._M_str = field_name._M_dataplus._M_p;
            local_80.piece_ =
                 absl::lts_20250127::NullSafeStringView
                           ("\" is not defined or is not an extension of \"");
            pcVar3 = (pDVar12->all_names_).payload_;
            full_type_name._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(pcVar3 + 2);
            full_type_name._M_string_length =
                 (size_type)(pcVar3 + ~(ulong)full_type_name._M_dataplus._M_p);
            prefix._0_16_ = absl::lts_20250127::NullSafeStringView("\".");
            absl::lts_20250127::StrCat<>
                      (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_148,&local_80
                       ,(AlphaNum *)&full_type_name,(AlphaNum *)&prefix);
            message_08._M_str = prefix_and_full_type_name._M_dataplus._M_p;
            message_08._M_len = prefix_and_full_type_name._M_string_length;
            ReportError(this,message_08);
            goto LAB_00221f9b;
          }
          lower_field_name._0_16_ = absl::lts_20250127::NullSafeStringView("Ignoring extension \"");
          local_148.piece_._M_len = field_name._M_string_length;
          local_148.piece_._M_str = field_name._M_dataplus._M_p;
          local_80.piece_ =
               absl::lts_20250127::NullSafeStringView
                         ("\" which is not defined or is not an extension of \"");
          pcVar3 = (pDVar12->all_names_).payload_;
          full_type_name._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(pcVar3 + 2);
          in_R8 = (AlphaNum *)&full_type_name;
          full_type_name._M_string_length =
               (size_type)(pcVar3 + ~(ulong)full_type_name._M_dataplus._M_p);
          prefix._0_16_ = absl::lts_20250127::NullSafeStringView("\".");
          absl::lts_20250127::StrCat<>
                    (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_148,&local_80,
                     in_R8,(AlphaNum *)&prefix);
          message_01._M_str = prefix_and_full_type_name._M_dataplus._M_p;
          message_01._M_len = prefix_and_full_type_name._M_string_length;
          ReportWarning(this,message_01);
          std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
          bVar5 = false;
          goto LAB_002215ed;
        }
LAB_002215fa:
        if ((field->options_->field_0)._impl_.deprecated_ == true) {
          lower_field_name._0_16_ =
               absl::lts_20250127::NullSafeStringView("text format contains deprecated field \"");
          local_148.piece_._M_len = field_name._M_string_length;
          local_148.piece_._M_str = field_name._M_dataplus._M_p;
          local_80.piece_ = absl::lts_20250127::NullSafeStringView("\"");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&full_type_name,(lts_20250127 *)&lower_field_name,&local_148,&local_80,in_R8);
          message_02._M_str = full_type_name._M_dataplus._M_p;
          message_02._M_len = full_type_name._M_string_length;
          ReportWarning(this,message_02);
          std::__cxx11::string::~string((string *)&full_type_name);
        }
        if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
          bVar5 = FieldDescriptor::is_repeated(field);
          if ((!bVar5) && (bVar5 = Reflection::HasField(this_01,message,field), bVar5)) {
            lower_field_name._0_16_ =
                 absl::lts_20250127::NullSafeStringView("Non-repeated field \"");
            local_148.piece_._M_len = field_name._M_string_length;
            local_148.piece_._M_str = field_name._M_dataplus._M_p;
            local_80.piece_ =
                 absl::lts_20250127::NullSafeStringView("\" is specified multiple times.");
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&full_type_name,(lts_20250127 *)&lower_field_name,&local_148,&local_80,in_R8)
            ;
            message_03._M_str = full_type_name._M_dataplus._M_p;
            message_03._M_len = full_type_name._M_string_length;
            ReportError(this,message_03);
            psVar13 = &full_type_name;
            goto LAB_00221fa0;
          }
          oneof_descriptor = FieldDescriptor::containing_oneof(field);
          if ((oneof_descriptor != (OneofDescriptor *)0x0) &&
             (bVar5 = Reflection::HasOneof(this_01,message,oneof_descriptor), bVar5)) {
            pFVar11 = Reflection::GetOneofFieldDescriptor(this_01,message,oneof_descriptor);
            lower_field_name._0_16_ = absl::lts_20250127::NullSafeStringView("Field \"");
            local_148.piece_._M_len = field_name._M_string_length;
            local_148.piece_._M_str = field_name._M_dataplus._M_p;
            local_80.piece_ =
                 absl::lts_20250127::NullSafeStringView("\" is specified along with field \"");
            puVar4 = (ushort *)(pFVar11->all_names_).payload_;
            full_type_name._M_dataplus._M_p = (pointer)(ulong)*puVar4;
            full_type_name._M_string_length = (long)puVar4 + ~(ulong)full_type_name._M_dataplus._M_p
            ;
            prefix._0_16_ = absl::lts_20250127::NullSafeStringView("\", another member of oneof \"")
            ;
            puVar4 = (ushort *)(oneof_descriptor->all_names_).payload_;
            serialized_value._M_dataplus._M_p = (pointer)(ulong)*puVar4;
            serialized_value._M_string_length =
                 (long)puVar4 + ~(ulong)serialized_value._M_dataplus._M_p;
            absl::lts_20250127::StrCat<std::basic_string_view<char,std::char_traits<char>>,char[3]>
                      (&prefix_and_full_type_name,(lts_20250127 *)&lower_field_name,&local_148,
                       &local_80,(AlphaNum *)&full_type_name,(AlphaNum *)&prefix,
                       (AlphaNum *)&serialized_value,
                       (basic_string_view<char,_std::char_traits<char>_> *)0x2d57d3,
                       (char (*) [3])field);
            message_04._M_str = prefix_and_full_type_name._M_dataplus._M_p;
            message_04._M_len = prefix_and_full_type_name._M_string_length;
            ReportError(this,message_04);
            goto LAB_00221f9b;
          }
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lower_field_name,":",(allocator<char> *)&local_148);
          bVar5 = TryConsumeBeforeWhitespace(this,&lower_field_name);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (((bVar5) &&
              (TryConsumeWhitespace(this), (field->options_->field_0)._impl_.weak_ == true)) &&
             ((this->tokenizer_).current_.type == TYPE_STRING)) {
            lower_field_name._M_string_length = 0;
            lower_field_name._M_dataplus._M_p = (pointer)&lower_field_name.field_2;
            lower_field_name.field_2._M_local_buf[0] = '\0';
            bVar5 = ConsumeString(this,&lower_field_name);
            if (bVar5) {
              pFVar2 = this->finder_;
              if (pFVar2 == (Finder *)0x0) {
                factory = (MessageFactory *)0x0;
              }
              else {
                iVar9 = (*pFVar2->_vptr_Finder[5])(pFVar2,field);
                factory = (MessageFactory *)CONCAT44(extraout_var_02,iVar9);
              }
              this_00 = &Reflection::MutableMessage(this_01,message,field,factory)->
                         super_MessageLite;
              data._M_str = lower_field_name._M_dataplus._M_p;
              data._M_len = lower_field_name._M_string_length;
              MessageLite::ParseFromString(this_00,data);
              bVar5 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,true);
            }
            else {
              bVar5 = false;
            }
            psVar13 = &lower_field_name;
            goto LAB_002220b7;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lower_field_name,":",(allocator<char> *)&local_148);
          bVar5 = ConsumeBeforeWhitespace(this,&lower_field_name);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (!bVar5) goto LAB_00221fa5;
          TryConsumeWhitespace(this);
        }
        bVar5 = FieldDescriptor::is_repeated(field);
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lower_field_name,"[",(allocator<char> *)&local_148);
          bVar5 = TryConsume(this,&lower_field_name);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&lower_field_name,"]",(allocator<char> *)&local_148);
            bVar5 = TryConsume(this,&lower_field_name);
            std::__cxx11::string::~string((string *)&lower_field_name);
            bVar8 = true;
            if (!bVar5) {
              do {
                if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
                  bVar5 = ConsumeFieldMessage(this,message,this_01,field);
                }
                else {
                  bVar5 = ConsumeFieldValue(this,message,this_01,field);
                }
                if (bVar5 == false) goto LAB_00221fa5;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&lower_field_name,"]",(allocator<char> *)&local_148);
                bVar5 = TryConsume(this,&lower_field_name);
                std::__cxx11::string::~string((string *)&lower_field_name);
                if (bVar5) goto LAB_00221da3;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&lower_field_name,",",(allocator<char> *)&local_148);
                bVar7 = Consume(this,&lower_field_name);
                std::__cxx11::string::~string((string *)&lower_field_name);
                bVar5 = false;
              } while (bVar7);
              goto LAB_002220bc;
            }
            goto LAB_00221da3;
          }
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
          bVar5 = ConsumeFieldMessage(this,message,this_01,field);
        }
        else {
          bVar5 = ConsumeFieldValue(this,message,this_01,field);
        }
        bVar8 = true;
        if (bVar5 != false) goto LAB_00221da3;
      }
    }
LAB_00221fa5:
    bVar5 = false;
  }
  else {
    bVar5 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
    if (!bVar5) goto LAB_00221fa5;
    TryConsumeWhitespace(this);
    if ((this->allow_field_number_ == true) &&
       (str._M_str = (char *)&serialized_value, str._M_len = (size_t)field_name._M_dataplus._M_p,
       bVar5 = absl::lts_20250127::SimpleAtoi<int>
                         ((lts_20250127 *)field_name._M_string_length,str,out), bVar5)) {
      bVar5 = Descriptor::IsExtensionNumber(pDVar12,(int)serialized_value._M_dataplus._M_p);
      if (bVar5) {
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          field = anon_unknown_14::DefaultFinderFindExtensionByNumber
                            (pDVar12,(int)serialized_value._M_dataplus._M_p);
        }
        else {
          iVar9 = (*pFVar2->_vptr_Finder[3])(pFVar2,pDVar12);
          field = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar9);
        }
      }
      else {
        bVar8 = Descriptor::IsReservedNumber(pDVar12,(int)serialized_value._M_dataplus._M_p);
        bVar5 = true;
        if (bVar8) goto LAB_002213fe;
        field = Descriptor::FindFieldByNumber(pDVar12,(int)serialized_value._M_dataplus._M_p);
      }
      bVar5 = false;
    }
    else {
      name._M_str = field_name._M_dataplus._M_p;
      name._M_len = field_name._M_string_length;
      field = Descriptor::FindFieldByName(pDVar12,name);
      if (field == (FieldDescriptor *)0x0) {
        std::__cxx11::string::string((string *)&lower_field_name,(string *)&field_name);
        absl::lts_20250127::AsciiStrToLower(&lower_field_name);
        name_00._M_str = lower_field_name._M_dataplus._M_p;
        name_00._M_len = lower_field_name._M_string_length;
        field = Descriptor::FindFieldByName(pDVar12,name_00);
        if (field != (FieldDescriptor *)0x0) {
          bVar5 = internal::cpp::IsGroupLike(field);
          if (bVar5) {
            if (field != (FieldDescriptor *)0x0) {
              pDVar10 = FieldDescriptor::message_type(field);
              puVar4 = (ushort *)(pDVar10->all_names_).payload_;
              __x._M_len = (ulong)*puVar4;
              __x._M_str = (char *)((long)puVar4 + ~__x._M_len);
              __y._M_str = field_name._M_dataplus._M_p;
              __y._M_len = field_name._M_string_length;
              bVar5 = std::operator!=(__x,__y);
              if (bVar5) goto LAB_002213de;
            }
          }
          else {
LAB_002213de:
            field = (FieldDescriptor *)0x0;
          }
        }
        std::__cxx11::string::~string((string *)&lower_field_name);
        if (field == (FieldDescriptor *)0x0) {
          if (this->allow_case_insensitive_field_ == true) {
            std::__cxx11::string::string((string *)&lower_field_name,(string *)&field_name);
            absl::lts_20250127::AsciiStrToLower(&lower_field_name);
            lowercase_name._M_str = lower_field_name._M_dataplus._M_p;
            lowercase_name._M_len = lower_field_name._M_string_length;
            field = Descriptor::FindFieldByLowercaseName(pDVar12,lowercase_name);
            std::__cxx11::string::~string((string *)&lower_field_name);
            if (field != (FieldDescriptor *)0x0) {
              bVar5 = false;
              goto LAB_002215ed;
            }
          }
          name_01._M_str = field_name._M_dataplus._M_p;
          name_01._M_len = field_name._M_string_length;
          bVar5 = Descriptor::IsReservedName(pDVar12,name_01);
          goto LAB_002213fe;
        }
      }
      bVar5 = false;
    }
LAB_002213fe:
    if ((field == (FieldDescriptor *)0x0) && (bVar5 == false)) {
      if (this->allow_unknown_field_ != false) {
        lower_field_name._0_16_ = absl::lts_20250127::NullSafeStringView("Message type \"");
        local_148.piece_._M_str = (pDVar12->all_names_).payload_;
        local_148.piece_._M_len = (size_t)*(ushort *)(local_148.piece_._M_str + 2);
        local_148.piece_._M_str = local_148.piece_._M_str + ~local_148.piece_._M_len;
        local_80.piece_ = absl::lts_20250127::NullSafeStringView("\" has no field named \"");
        in_R8 = (AlphaNum *)&full_type_name;
        full_type_name._M_dataplus._M_p = (pointer)field_name._M_string_length;
        full_type_name._M_string_length = (size_type)field_name._M_dataplus._M_p;
        prefix._0_16_ = absl::lts_20250127::NullSafeStringView("\".");
        absl::lts_20250127::StrCat<>
                  (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_148,&local_80,
                   in_R8,(AlphaNum *)&prefix);
        message_00._M_str = prefix_and_full_type_name._M_dataplus._M_p;
        message_00._M_len = prefix_and_full_type_name._M_string_length;
        ReportWarning(this,message_00);
        std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
        goto LAB_002215ed;
      }
      lower_field_name._0_16_ = absl::lts_20250127::NullSafeStringView("Message type \"");
      local_148.piece_._M_str = (pDVar12->all_names_).payload_;
      local_148.piece_._M_len = (size_t)*(ushort *)(local_148.piece_._M_str + 2);
      local_148.piece_._M_str = local_148.piece_._M_str + ~local_148.piece_._M_len;
      local_80.piece_ = absl::lts_20250127::NullSafeStringView("\" has no field named \"");
      full_type_name._M_dataplus._M_p = (pointer)field_name._M_string_length;
      full_type_name._M_string_length = (size_type)field_name._M_dataplus._M_p;
      prefix._0_16_ = absl::lts_20250127::NullSafeStringView("\".");
      absl::lts_20250127::StrCat<>
                (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_148,&local_80,
                 (AlphaNum *)&full_type_name,(AlphaNum *)&prefix);
      message_07._M_str = prefix_and_full_type_name._M_dataplus._M_p;
      message_07._M_len = prefix_and_full_type_name._M_string_length;
      ReportError(this,message_07);
LAB_00221f9b:
      psVar13 = &prefix_and_full_type_name;
LAB_00221fa0:
      std::__cxx11::string::~string((string *)psVar13);
      goto LAB_00221fa5;
    }
LAB_002215ed:
    if (field != (FieldDescriptor *)0x0) goto LAB_002215fa;
    if (((this->allow_unknown_extension_ | this->allow_unknown_field_) & 1U) == 0 && bVar5 == false)
    {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&lower_field_name,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x261,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&lower_field_name);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lower_field_name,":",(allocator<char> *)&local_148);
    bVar5 = TryConsumeBeforeWhitespace(this,&lower_field_name);
    std::__cxx11::string::~string((string *)&lower_field_name);
    if (bVar5) {
      TryConsumeWhitespace(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,"{",(allocator<char> *)&local_80);
      psVar13 = &(this->tokenizer_).current_.text;
      _Var6 = std::operator==(psVar13,&lower_field_name);
      if (_Var6) {
        std::__cxx11::string::~string((string *)&lower_field_name);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"<",(allocator<char> *)&full_type_name);
        _Var6 = std::operator==(psVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&lower_field_name);
        if (!_Var6) {
          bVar8 = SkipFieldValue(this);
          goto LAB_00221da3;
        }
      }
    }
    bVar8 = SkipFieldMessage(this);
LAB_00221da3:
    bVar5 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,bVar8);
  }
LAB_002220bc:
  std::__cxx11::string::~string((string *)&field_name);
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    auto skip_parsing = [&](bool result) {
      // For historical reasons, fields may optionally be separated by commas or
      // semicolons.
      TryConsume(";") || TryConsume(",");

      // If a parse info tree exists, add the location for the parsed
      // field.
      if (parse_info_tree_ != nullptr) {
        int end_line = tokenizer_.previous().line;
        int end_column = tokenizer_.previous().end_column;

        RecordLocation(
            parse_info_tree_, field,
            ParseLocationRange(ParseLocation(start_line, start_column),
                               ParseLocation(end_line, end_column)));
      }

      return result;
    };

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return skip_parsing(true);
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return skip_parsing(SkipFieldValue());
        }
      }
      return skip_parsing(SkipFieldMessage());
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        return skip_parsing(true);
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }

    return skip_parsing(true);
  }